

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test_driver.h
# Opt level: O0

void __thiscall libaom_test::Encoder::Control(Encoder *this,int ctrl_id,aom_svc_params *arg)

{
  bool bVar1;
  char *message;
  AssertHelper *this_00;
  Message *in_RDX;
  uint in_ESI;
  char *in_RDI;
  AssertionResult gtest_ar;
  aom_codec_err_t res;
  char **in_stack_ffffffffffffff68;
  Message *in_stack_ffffffffffffff70;
  aom_codec_err_t *in_stack_ffffffffffffff78;
  Encoder *in_stack_ffffffffffffff80;
  int line;
  AssertionResult *this_01;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_30;
  aom_codec_err_t local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  local_1c = aom_codec_control((aom_codec_ctx_t *)(in_RDI + 8),(int)(ulong)in_ESI,in_RDX);
  this_01 = &local_30;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_RDI,(char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (aom_codec_err_t *)in_stack_ffffffffffffff70);
  line = (int)((ulong)in_RDI >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    message = EncoderError(in_stack_ffffffffffffff80);
    testing::Message::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1419f1)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,&this_01->success_,line,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x141a3f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x141a8f);
  return;
}

Assistant:

void Control(int ctrl_id, struct aom_svc_params *arg) {
    const aom_codec_err_t res = aom_codec_control(&encoder_, ctrl_id, arg);
    ASSERT_EQ(AOM_CODEC_OK, res) << EncoderError();
  }